

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_count(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi64 iValue;
  jx9_value *pjVar2;
  uint uVar3;
  
  if (nArg < 1) {
    uVar3 = 0;
  }
  else {
    pjVar2 = *apArg;
    if ((pjVar2->iFlags & 0x40U) != 0) {
      uVar3 = 0;
      if (nArg != 1) {
        iVar1 = jx9_value_to_int(apArg[1]);
        uVar3 = (uint)(iVar1 == 1);
        pjVar2 = *apArg;
      }
      iValue = HashmapCount((jx9_hashmap *)(pjVar2->x).pOther,uVar3,0);
      jx9_result_int64(pCtx,iValue);
      return 0;
    }
    uVar3 = (uint)((pjVar2->iFlags & 0x20U) == 0);
  }
  jx9_result_int(pCtx,uVar3);
  return 0;
}

Assistant:

static int jx9_hashmap_count(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int bRecursive = FALSE;
	sxi64 iCount;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* TICKET 1433-19: Handle objects */
		int res = !jx9_value_is_null(apArg[0]);
		jx9_result_int(pCtx, res);
		return JX9_OK;
	}
	if( nArg > 1 ){
		/* Recursive count? */
		bRecursive = jx9_value_to_int(apArg[1]) == 1 /* COUNT_RECURSIVE */;
	}
	/* Count */
	iCount = HashmapCount((jx9_hashmap *)apArg[0]->x.pOther, bRecursive, 0);
	jx9_result_int64(pCtx, iCount);
	return JX9_OK;
}